

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

int hdr_value_at_percentiles(hdr_histogram *h,double *percentiles,int64_t *values,size_t length)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  byte bVar6;
  int64_t iVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  hdr_iter iter;
  hdr_iter local_b0;
  
  iVar3 = 0x16;
  if (values != (int64_t *)0x0 && percentiles != (double *)0x0) {
    if (length != 0) {
      lVar8 = h->total_count;
      sVar4 = 0;
      do {
        dVar10 = percentiles[sVar4];
        if (100.0 <= dVar10) {
          dVar10 = 100.0;
        }
        iVar7 = (int64_t)((dVar10 / 100.0) * (double)lVar8 + 0.5);
        if (iVar7 < 2) {
          iVar7 = 1;
        }
        values[sVar4] = iVar7;
        sVar4 = sVar4 + 1;
      } while (length != sVar4);
    }
    local_b0.counts_index = -1;
    local_b0.total_count = h->total_count;
    local_b0.count = 0;
    local_b0.cumulative_count = 0;
    local_b0.value = 0;
    local_b0.highest_equivalent_value = 0;
    local_b0.value_iterated_from = 0;
    local_b0.value_iterated_to = 0;
    local_b0._next_fp = all_values_iter_next;
    local_b0.h = h;
    _Var2 = all_values_iter_next(&local_b0);
    if (length != 0 && _Var2) {
      uVar9 = 0;
      lVar8 = 0;
      do {
        lVar8 = lVar8 + local_b0.count;
        do {
          if (lVar8 < values[uVar9]) break;
          uVar5 = h->sub_bucket_mask | local_b0.value;
          lVar1 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          bVar6 = 0x3f - (((byte)lVar1 ^ 0x3f) + (char)h->sub_bucket_half_count_magnitude);
          iVar3 = (int)(local_b0.value >> (bVar6 & 0x3f));
          values[uVar9] =
               ((long)iVar3 << (bVar6 & 0x3f)) +
               (1L << ((h->sub_bucket_count <= iVar3) + bVar6 & 0x3f)) + -1;
          uVar9 = uVar9 + 1;
        } while (uVar9 < length);
        _Var2 = (*local_b0._next_fp)(&local_b0);
      } while ((uVar9 < length) && (_Var2));
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int hdr_value_at_percentiles(const struct hdr_histogram *h, const double *percentiles, int64_t *values, size_t length)
{
    if (NULL == percentiles || NULL == values)
    {
        return EINVAL;
    }

    struct hdr_iter iter;
    const int64_t total_count = h->total_count;
    // to avoid allocations we use the values array for intermediate computation
    // i.e. to store the expected cumulative count at each percentile
    for (size_t i = 0; i < length; i++)
    {
        const double requested_percentile = percentiles[i] < 100.0 ? percentiles[i] : 100.0;
        const int64_t count_at_percentile =
        (int64_t) (((requested_percentile / 100) * total_count) + 0.5);
        values[i] = count_at_percentile > 1 ? count_at_percentile : 1;
    }

    hdr_iter_init(&iter, h);
    int64_t total = 0;
    size_t at_pos = 0;
    while (hdr_iter_next(&iter) && at_pos < length)
    {
        total += iter.count;
        while (at_pos < length && total >= values[at_pos])
        {
            values[at_pos] = highest_equivalent_value(h, iter.value);
            at_pos++;
        }
    }
    return 0;
}